

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt_test.cpp
# Opt level: O3

void __thiscall
NTT_MultipliesSimple_Test::~NTT_MultipliesSimple_Test(NTT_MultipliesSimple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(NTT, MultipliesSimple) {
    initNTT();
    vector<ll> p1 = {8, 2, 1, 6, 3};
    vector<ll> p2 = {3, 4, 2};
    vector<ll> res = multiplyPolynomialsNTT(p1, p2);
    vector<ll> want = multiplyNaiveNTT(p1, p2);
    EXPECT_EQ(res, want);
    //(vector<ll> {24, 38, 27, 26, 35, 24, 6, 0, 0, 0, 0, 0, 0, 0, 0, 0})
}